

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall MCU::idct(MCU *this)

{
  double *pdVar1;
  long lVar2;
  BLOCK (*paaaadVar3) [2] [2];
  long lVar4;
  double (*padVar5) [8];
  int i;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  void *extraout_RDX_01;
  long lVar7;
  int j;
  int y;
  ulong uVar8;
  BLOCK (**ppaaaadVar9) [2] [2];
  double *pdVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  BLOCK (*local_478) [2] [2];
  long local_470;
  long local_468;
  BLOCK (*local_460) [2] [2];
  BLOCK (*local_458) [2] [2];
  ulong local_450;
  long local_448;
  ulong local_440;
  double s [8] [8];
  double tmp [8] [8];
  
  local_458 = this->mcu;
  for (lVar7 = 1; local_460 = local_458 + 1, lVar7 != 4; lVar7 = lVar7 + 1) {
    local_458 = local_460;
    local_448 = lVar7;
    for (local_450 = 0; local_450 < subVector[lVar7].height; local_450 = local_450 + 1) {
      local_478 = local_460;
      for (local_440 = 0; local_440 < subVector[lVar7].width; local_440 = local_440 + 1) {
        memset(tmp,0,0x200);
        memset(s,0,0x200);
        lVar7 = 8;
        lVar2 = 0;
        pvVar6 = extraout_RDX;
        while (lVar2 != 8) {
          lVar4 = 0;
          paaaadVar3 = local_478;
          local_470 = lVar2;
          while (lVar4 != 8) {
            pdVar1 = s[local_470] + lVar4;
            pdVar10 = cos_cache;
            local_468 = lVar4;
            for (uVar8 = 0; uVar8 != 8; uVar8 = uVar8 + 1) {
              c(this,(void *)(uVar8 & 0xffffffff),pvVar6);
              *pdVar1 = extraout_XMM0_Qa * (*paaaadVar3)[0][0][0][uVar8] * *pdVar10 + *pdVar1;
              pdVar10 = (double *)((long)pdVar10 + lVar7);
              pvVar6 = extraout_RDX_00;
            }
            *pdVar1 = *pdVar1 * 0.5;
            paaaadVar3 = (BLOCK (*) [2] [2])((*paaaadVar3)[0][0] + 1);
            lVar4 = local_468 + 1;
          }
          lVar7 = lVar7 + 0x10;
          lVar2 = local_470 + 1;
        }
        lVar7 = 8;
        lVar2 = 0;
        while (lVar2 != 8) {
          lVar4 = 0;
          ppaaaadVar9 = &local_478;
          local_470 = lVar2;
          while (ppaaaadVar9 = (BLOCK (**) [2] [2])((long)ppaaaadVar9 + 0x40), lVar4 != 8) {
            pdVar1 = tmp[local_470] + lVar4;
            pdVar10 = cos_cache;
            local_468 = lVar4;
            for (uVar8 = 0; uVar8 != 8; uVar8 = uVar8 + 1) {
              c(this,(void *)(uVar8 & 0xffffffff),pvVar6);
              *pdVar1 = extraout_XMM0_Qa_00 * *(double *)((long)ppaaaadVar9 + uVar8 * 8) * *pdVar10
                        + *pdVar1;
              pdVar10 = (double *)((long)pdVar10 + lVar7);
              pvVar6 = extraout_RDX_01;
            }
            *pdVar1 = *pdVar1 * 0.5;
            lVar4 = local_468 + 1;
          }
          lVar7 = lVar7 + 0x10;
          lVar2 = local_470 + 1;
        }
        padVar5 = tmp;
        paaaadVar3 = local_478;
        for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
          for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
            (*paaaadVar3)[0][0][0][lVar2] = (*padVar5)[lVar2];
          }
          padVar5 = padVar5 + 1;
          paaaadVar3 = (BLOCK (*) [2] [2])((*paaaadVar3)[0][0] + 1);
        }
        local_478 = (BLOCK (*) [2] [2])((*local_478)[0] + 1);
        lVar7 = local_448;
      }
      local_460 = (BLOCK (*) [2] [2])(*local_460 + 1);
    }
  }
  return;
}

Assistant:

void idct() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    double tmp[8][8] = {0};
//					 照定義展開，效能低下
//                     for (int i = 0; i < 8; i++) {
//                         for (int j = 0; j < 8; j++) {
//                             for (int x = 0; x < 8; x++) {
//                                 for (int y = 0; y < 8; y++) {
//                                     tmp[i][j] += (cc(x, y) * mcu[id][h][w][x][y] * cos((2*i+1)*M_PI/16.0*x) * cos((2*j+1)*M_PI/16.0*y));
//                                 }
//                             }
//                             tmp[i][j] /= 4.0;
//                         }
//                     }
					// 計算兩次一維idct去計算二維idct
                    double s[8][8] = {};
                    for (int j = 0; j < 8; j++) {
                        for (int x = 0; x < 8; x++) {
                            for (int y = 0; y < 8; y++) {
                                s[j][x] += c (y) * mcu[id][h][w][x][y] * cos_cache[(j + j + 1) * y];
                            }
                            s[j][x] = s[j][x] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            for (int x = 0; x < 8; x++) {
                                tmp[i][j] += c(x) * s[j][x] * cos_cache[(i + i + 1) * x];
                            }
                            tmp[i][j] = tmp[i][j] / 2.0;
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = tmp[i][j];
                        }
                    }
                }
            }
        }
    }